

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

class_<sophia_interface,_std::shared_ptr<sophia_interface>_> * __thiscall
pybind11::class_<sophia_interface,std::shared_ptr<sophia_interface>>::
def<sophiaevent_output(sophia_interface::*)(bool,double,double,bool),pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg_v>
          (class_<sophia_interface,std::shared_ptr<sophia_interface>> *this,char *name_,
          offset_in_sophia_interface_to_subr *f,arg *extra,arg *extra_1,arg *extra_2,arg_v *extra_3)

{
  offset_in_sophia_interface_to_subr f_00;
  name *extra_00;
  handle obj;
  cpp_function key;
  is_method local_88;
  PyObject *local_80;
  handle local_78;
  object local_70;
  arg *local_68;
  arg *local_60;
  object local_58;
  object local_50;
  handle local_48;
  handle local_40;
  cpp_function cf;
  
  f_00 = *f;
  extra_00 = (name *)f[1];
  local_58.super_handle.m_ptr = *(handle *)this;
  local_50.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_88.class_.m_ptr = (handle)(handle)name_;
  local_68 = extra;
  local_60 = extra_1;
  local_48.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_48.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_48.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  cf.super_function.super_object.super_handle.m_ptr = (function)(function)local_48.m_ptr;
  cpp_function::
  cpp_function<sophiaevent_output,sophia_interface,bool,double,double,bool,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg_v>
            ((cpp_function *)&local_40,f_00,extra_00,&local_88,(sibling *)&local_58,(arg *)&cf,
             local_68,local_60,(arg_v *)extra_2);
  object::~object((object *)&local_48);
  object::~object(&local_50);
  cpp_function::name(&cf);
  key = cf;
  obj.m_ptr = *(PyObject **)this;
  if ((object)cf.super_function.super_object.super_handle.m_ptr != (PyObject *)0x0) {
    *(long *)cf.super_function.super_object.super_handle.m_ptr =
         *(long *)cf.super_function.super_object.super_handle.m_ptr + 1;
  }
  local_78.m_ptr = (PyObject *)cf.super_function.super_object.super_handle.m_ptr;
  local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_70.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_80 = obj.m_ptr;
  object::~object(&local_58);
  detail::accessor_policies::obj_attr::set
            (obj,(handle)key.super_function.super_object.super_handle.m_ptr,local_40);
  object::~object(&local_70);
  object::~object((object *)&local_78);
  object::~object((object *)&cf);
  object::~object((object *)&local_40);
  return (class_<sophia_interface,_std::shared_ptr<sophia_interface>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }